

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O2

_Bool container_iterator_next
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  ushort uVar1;
  long lVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 3) {
    uVar1 = *value;
    if (uVar1 != 0xffff) {
      lVar2 = *(long *)((long)c + 8);
      lVar7 = (long)it->index;
      uVar10 = (uint)*(ushort *)(lVar2 + 2 + lVar7 * 4) + (uint)*(ushort *)(lVar2 + lVar7 * 4);
      if (uVar10 < uVar1 || uVar10 == uVar1) {
        iVar5 = it->index + 1;
        it->index = iVar5;
        if (*c <= iVar5) {
          return false;
        }
        uVar4 = *(uint16_t *)(lVar2 + 4 + lVar7 * 4);
      }
      else {
        uVar4 = uVar1 + 1;
      }
LAB_001156c2:
      *value = uVar4;
      return true;
    }
  }
  else if (iVar5 == 2) {
    iVar5 = it->index;
    iVar6 = iVar5 + 1;
    it->index = iVar6;
    if (iVar6 < *c) {
      uVar4 = *(uint16_t *)(*(long *)((long)c + 8) + 2 + (long)iVar5 * 2);
      goto LAB_001156c2;
    }
  }
  else {
    iVar5 = it->index + 1;
    it->index = iVar5;
    bVar3 = (byte)(iVar5 % 0x40);
    uVar10 = (uint)((long)iVar5 / 0x40);
    if (uVar10 < 0x400) {
      uVar9 = (long)iVar5 / 0x40 & 0xffffffff;
      uVar8 = (*(ulong *)(*(long *)((long)c + 8) + uVar9 * 8) >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
      iVar6 = uVar10 << 6;
      iVar5 = (uVar10 & 0x3ff) << 6;
      for (; (uVar8 == 0 && (uVar9 < 0x3ff)); uVar9 = uVar9 + 1) {
        uVar8 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar9 * 8);
        iVar6 = iVar6 + 0x40;
        iVar5 = iVar5 + 0x40;
      }
      if (uVar8 != 0) {
        lVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        it->index = iVar6 + (int)lVar2;
        uVar4 = (short)iVar5 + (short)lVar2;
        goto LAB_001156c2;
      }
    }
  }
  return false;
}

Assistant:

bool container_iterator_next(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index++;

            uint32_t wordindex = it->index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) {
                return false;
            }

            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            // next part could be optimized/simplified
            while (word == 0 &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index++;
            if (it->index < ac->cardinality) {
                *value = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == UINT16_MAX) {  // Avoid overflow to zero
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            uint32_t limit =
                rc->runs[it->index].value + rc->runs[it->index].length;
            if (*value < limit) {
                (*value)++;
                return true;
            }

            it->index++;
            if (it->index < rc->n_runs) {
                *value = rc->runs[it->index].value;
                return true;
            }
            return false;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}